

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

TimeInMillis testing::internal::GetTimeInMillis(void)

{
  long lVar1;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  return lVar1 / 1000000;
}

Assistant:

TimeInMillis GetTimeInMillis() {
  return std::chrono::duration_cast<std::chrono::milliseconds>(
             std::chrono::system_clock::now() -
             std::chrono::system_clock::from_time_t(0))
      .count();
}